

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderVSGSVariableQualifierMismatchTest::iterate
          (GeometryShaderVSGSVariableQualifierMismatchTest *this)

{
  ostringstream *this_00;
  _func_int *p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  ContextType CVar7;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *description;
  qpTestResult testResult;
  bool has_shader_compilation_failed;
  char *gs_code_specialized_raw;
  char *fs_code_specialized_raw;
  char *vs_code_raw;
  string vs_code_specialized;
  string gs_code_specialized;
  string fs_code_specialized;
  char *vs_code_specialized_raw;
  char *gs_code_raw;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  long lVar8;
  
  has_shader_compilation_failed = true;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0x43d);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  GVar5 = (**(code **)(lVar8 + 0x3c8))();
  this->m_po_id = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x445);
  GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar5;
  GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar5;
  GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x44c);
  gs_code_raw = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nin flat vec4 test[];\n\nvoid main()\n{\n    gl_Position = test[0];\n    EmitVertex();\n}\n"
  ;
  vs_code_raw = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nout vec4 test;\n\nvoid main()\n{\n    test = vec4(gl_VertexID);\n}\n"
  ;
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&this->super_TestCaseBase,1,&dummy_fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&gs_code_specialized,&this->super_TestCaseBase,1,&gs_code_raw);
  gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&this->super_TestCaseBase,1,&vs_code_raw);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  bVar2 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                     &gs_code_specialized_raw,this->m_vs_id,1,&vs_code_specialized_raw,this->m_fs_id
                     ,1,&fs_code_specialized_raw,&has_shader_compilation_failed);
  p_Var1 = ((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2];
  if (bVar2) {
    CVar7.super_ApiType.m_bits = (ApiType)(*p_Var1)();
    bVar3 = glu::contextSupports(CVar7,(ApiType)0x103);
    bVar2 = true;
    if (!bVar3) {
      local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),
                 "Program object was linked successfully, whereas a failure was expected.",0x47);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d06648:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
      std::ios_base::~ios_base(local_120);
      bVar2 = false;
    }
  }
  else {
    CVar7.super_ApiType.m_bits = (ApiType)(*p_Var1)();
    bVar3 = glu::contextSupports(CVar7,(ApiType)0x103);
    bVar2 = true;
    if (bVar3) {
      local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),"Program object linking failed. Success was expected.",
                 0x34);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00d06648;
    }
  }
  if (has_shader_compilation_failed == true) {
    local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Shader compilation failed unexpectedly.",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
  }
  else if (bVar2) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
    goto LAB_00d066ea;
  }
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00d066ea:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
    operator_delete(vs_code_specialized._M_dataplus._M_p,
                    vs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gs_code_specialized._M_dataplus._M_p != &gs_code_specialized.field_2) {
    operator_delete(gs_code_specialized._M_dataplus._M_p,
                    gs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
    operator_delete(fs_code_specialized._M_dataplus._M_p,
                    fs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderVSGSVariableQualifierMismatchTest::iterate()
{
	bool has_shader_compilation_failed = true;
	bool result						   = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create a program object */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	const char* gs_code_raw = "${VERSION}\n"
							  "${GEOMETRY_SHADER_REQUIRE}\n"
							  "\n"
							  "layout (points)                   in;\n"
							  "layout (points, max_vertices = 1) out;\n"
							  "\n"
							  "in flat vec4 test[];\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    gl_Position = test[0];\n"
							  "    EmitVertex();\n"
							  "}\n";

	const char* vs_code_raw = "${VERSION}\n"
							  "${GEOMETRY_SHADER_REQUIRE}\n"
							  "\n"
							  "out vec4 test;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    test = vec4(gl_VertexID);\n"
							  "}\n";

	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();
	std::string gs_code_specialized		= specializeShader(1, &gs_code_raw);
	const char* gs_code_specialized_raw = gs_code_specialized.c_str();
	std::string vs_code_specialized		= specializeShader(1, &vs_code_raw);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	bool buildSuccess = TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,					 /* n_sh1_body_parts */
												   &gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
												   &vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
												   &fs_code_specialized_raw, &has_shader_compilation_failed);

	if (!buildSuccess && glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed. Success was expected."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (buildSuccess && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Program object was linked successfully, whereas a failure was expected."
						   << tcu::TestLog::EndMessage;
		result = false;
	}

	if (has_shader_compilation_failed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Shader compilation failed unexpectedly."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}